

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall Test_Template_Variable::Test_Template_Variable(Test_Template_Variable *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, Variable) {
  Template* tpl = StringToTemplate("hi {{VAR}} lo", STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  AssertExpandIs(tpl, &dict, "hi  lo", true);
  dict.SetValue("VAR", "yo");
  AssertExpandIs(tpl, &dict, "hi yo lo", true);
  dict.SetValue("VAR", "yoyo");
  AssertExpandIs(tpl, &dict, "hi yoyo lo", true);
  dict.SetValue("VA", "noyo");
  dict.SetValue("VAR ", "noyo2");
  dict.SetValue("var", "noyo3");
  AssertExpandIs(tpl, &dict, "hi yoyo lo", true);

  // Sanity check string template behaviour while we're at it.
  Template* tpl2 = Template::StringToTemplate("hi {{VAR}} lo",
                                              STRIP_WHITESPACE);
  TemplateDictionary dict2("dict");
  AssertExpandIs(tpl2, &dict2, "hi  lo", true);
  dict2.SetValue("VAR", "yo");
  AssertExpandIs(tpl2, &dict2, "hi yo lo", true);
  dict2.SetValue("VAR", "yoyo");
  AssertExpandIs(tpl2, &dict2, "hi yoyo lo", true);
  dict2.SetValue("VA", "noyo");
  dict2.SetValue("VAR ", "noyo2");
  dict2.SetValue("var", "noyo3");
  AssertExpandIs(tpl2, &dict2, "hi yoyo lo", true);
  delete tpl2;   // You have to delete StringToTemplate strings
}